

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::CTcDataStream(CTcDataStream *this,char stream_id)

{
  CTcPrsMem *this_00;
  
  this->_vptr_CTcDataStream = (_func_int **)&PTR__CTcDataStream_00307db8;
  this->stream_id_ = stream_id;
  this->ofs_ = 0;
  this->obj_file_start_ofs_ = 0;
  this->wp_ = (char *)0x0;
  this->rem_ = 0;
  this->page_cur_ = 0;
  this->pages_ = (char **)0x0;
  this->page_slots_ = 0;
  this->page_cnt_ = 0;
  this->first_anchor_ = (CTcStreamAnchor *)0x0;
  this->last_anchor_ = (CTcStreamAnchor *)0x0;
  this_00 = (CTcPrsMem *)operator_new(0x20);
  CTcPrsMem::CTcPrsMem(this_00);
  this->allocator_ = this_00;
  return;
}

Assistant:

CTcDataStream::CTcDataStream(char stream_id)
{
    /* remember my ID */
    stream_id_ = stream_id;

    /* nothing is allocated yet */
    ofs_ = 0;
    obj_file_start_ofs_ = 0;
    pages_ = 0;
    page_slots_ = 0;
    page_cnt_ = 0;
    page_cur_ = 0;
    rem_ = 0;
    wp_ = 0;

    /* we have no anchors yet */
    first_anchor_ = last_anchor_ = 0;

    /* create our parser memory allocator */
    allocator_ = new CTcPrsMem();
}